

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

void __thiscall
ot::commissioner::DtlsSession::DtlsSession
          (DtlsSession *this,event_base *aEventBase,bool aIsServer,SocketPtr *aSocket)

{
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  (this->super_Endpoint).mReceiver.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Endpoint).mReceiver._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_Endpoint).mReceiver.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Endpoint).mReceiver.super__Function_base._M_functor + 8) = 0;
  (this->super_Endpoint)._vptr_Endpoint = (_func_int **)&PTR__DtlsSession_0028cb50;
  std::__shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->mSocket).
              super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>,
             &aSocket->super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(ot::commissioner::Timer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp:119:35)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(ot::commissioner::Timer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp:119:35)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  DtlsTimer::DtlsTimer(&this->mHandshakeTimer,aEventBase,(Action *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  this->mState = kOpen;
  this->mIsServer = aIsServer;
  this->mIsClientIdSet = false;
  (this->mKek).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mKek).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mKek).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->mOnConnected).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mOnConnected).super__Function_base._M_functor + 8) = 0;
  (this->mOnConnected).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mOnConnected)._M_invoker = (_Invoker_type)0x0;
  std::
  queue<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>>
  ::
  queue<std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>,void>
            (&this->mSendQueue);
  (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mCipherSuites).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp:123:30)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp:123:30)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  (*((this->mSocket).super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->_vptr_Socket[8])();
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  InitMbedtls(this);
  return;
}

Assistant:

DtlsSession::DtlsSession(struct event_base *aEventBase, bool aIsServer, SocketPtr aSocket)
    : mSocket(aSocket)
    , mHandshakeTimer(aEventBase, [this](Timer &aTimer) { HandshakeTimerCallback(aTimer); })
    , mState(State::kOpen)
    , mIsServer(aIsServer)
{
    mSocket->SetEventHandler([this](short aFlags) { HandleEvent(aFlags); });
    InitMbedtls();
}